

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O3

void __thiscall
cmTargetPropCommandBase::cmTargetPropCommandBase
          (cmTargetPropCommandBase *this,cmExecutionStatus *status)

{
  this->_vptr_cmTargetPropCommandBase = (_func_int **)&PTR__cmTargetPropCommandBase_00a3b390;
  (this->Property)._M_dataplus._M_p = (pointer)&(this->Property).field_2;
  (this->Property)._M_string_length = 0;
  (this->Property).field_2._M_local_buf[0] = '\0';
  this->Target = (cmTarget *)0x0;
  this->Makefile = status->Makefile;
  this->Status = status;
  return;
}

Assistant:

cmTargetPropCommandBase::cmTargetPropCommandBase(cmExecutionStatus& status)
  : Makefile(&status.GetMakefile())
  , Status(status)
{
}